

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2dense.c
# Opt level: O1

int mod2dense_flip(mod2dense *m,int row,int col)

{
  uint *puVar1;
  uint uVar2;
  undefined4 uVar3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  int extraout_EAX;
  int extraout_EAX_00;
  uint uVar8;
  int extraout_EAX_01;
  uint uVar9;
  mod2entry *extraout_RAX;
  ulong uVar10;
  FILE *pFVar11;
  FILE *pFVar12;
  mod2entry *extraout_RAX_00;
  mod2entry *pmVar13;
  size_t sVar14;
  byte bVar15;
  ulong uVar16;
  ulong extraout_RDX;
  int *extraout_RDX_00;
  FILE *r;
  long extraout_RDX_01;
  ulong uVar17;
  long extraout_RDX_02;
  FILE *unaff_RBX;
  uint uVar18;
  int iVar19;
  undefined4 in_register_00000034;
  FILE *r_00;
  uint *puVar20;
  ulong uVar21;
  long lVar22;
  int iVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  FILE *pFVar28;
  bool bVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  int iStack_1bc;
  FILE *pFStack_1b8;
  FILE *pFStack_1b0;
  code *pcStack_1a8;
  FILE *pFStack_198;
  FILE *pFStack_190;
  ulong uStack_188;
  long lStack_f0;
  uint uStack_e8;
  int iStack_e4;
  
  pFVar11 = (FILE *)CONCAT44(in_register_00000034,row);
  if ((((-1 < row) && (-1 < col)) && (row < m->n_rows)) && (col < m->n_cols)) {
    uVar9 = m->col[(uint)col][(uint)row >> 5];
    bVar29 = (uVar9 >> (row & 0x1fU) & 1) == 0;
    uVar2 = uVar9 & ~(1 << (row & 0x1fU));
    if (bVar29) {
      uVar2 = uVar9 | 1 << (row & 0x1fU);
    }
    m->col[(uint)col][(uint)row >> 5] = uVar2;
    return (uint)bVar29;
  }
  mod2dense_flip_cold_1();
  if ((((FILE *)m)->_flags == *(int *)&pFVar11->field_0x4) &&
     (unaff_RBX = pFVar11, *(int *)&((FILE *)m)->field_0x4 == pFVar11->_flags)) {
    if (pFVar11 != (FILE *)m) {
      mod2dense_clear((mod2dense *)pFVar11);
      pmVar13 = extraout_RAX;
      if (0 < *(int *)&((FILE *)m)->field_0x4) {
        pmVar13 = (mod2entry *)((FILE *)m)->_IO_read_end;
        uVar16 = 0;
        uVar10 = extraout_RDX;
        do {
          if (0 < *(int *)&pFVar11->field_0x4) {
            puVar20 = *(uint **)(&pmVar13->row + uVar16 * 2);
            lVar22 = 0;
            iVar23 = 0;
            do {
              if (iVar23 == 0) {
                uVar10 = (ulong)*puVar20;
                puVar20 = puVar20 + 1;
                iVar23 = 0x20;
              }
              if ((uVar10 & 1) != 0) {
                puVar1 = (uint *)(*(long *)(&((mod2entry *)pFVar11->_IO_read_end)->row + lVar22 * 2)
                                 + (uVar16 >> 5 & 0x7ffffff) * 4);
                *puVar1 = *puVar1 | 1 << ((byte)uVar16 & 0x1f);
              }
              uVar10 = uVar10 >> 1 & 0x7fffffff;
              iVar23 = iVar23 + -1;
              lVar22 = lVar22 + 1;
            } while (lVar22 < *(int *)&pFVar11->field_0x4);
          }
          uVar16 = uVar16 + 1;
        } while ((long)uVar16 < (long)*(int *)&((FILE *)m)->field_0x4);
      }
      return (int)pmVar13;
    }
  }
  else {
    mod2dense_transpose_cold_1();
  }
  mod2dense_transpose_cold_2();
  if (((((FILE *)m)->_flags == *extraout_RDX_00) &&
      (*(int *)&((FILE *)m)->field_0x4 == extraout_RDX_00[1])) &&
     ((pFVar11->_flags == *extraout_RDX_00 && (*(int *)&pFVar11->field_0x4 == extraout_RDX_00[1]))))
  {
    if (0 < extraout_RDX_00[1]) {
      lVar22 = 0;
      do {
        if (0 < extraout_RDX_00[2]) {
          lVar26 = *(long *)(&((mod2entry *)((FILE *)m)->_IO_read_end)->row + lVar22 * 2);
          lVar4 = *(long *)(&((mod2entry *)pFVar11->_IO_read_end)->row + lVar22 * 2);
          lVar5 = *(long *)(*(long *)(extraout_RDX_00 + 4) + lVar22 * 8);
          lVar24 = 0;
          do {
            *(uint *)(lVar5 + lVar24 * 4) =
                 *(uint *)(lVar4 + lVar24 * 4) ^ *(uint *)(lVar26 + lVar24 * 4);
            lVar24 = lVar24 + 1;
          } while (lVar24 < extraout_RDX_00[2]);
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 < extraout_RDX_00[1]);
    }
    return extraout_EAX;
  }
  mod2dense_add_cold_1();
  if (((*(int *)&((FILE *)m)->field_0x4 == pFVar11->_flags) &&
      (unaff_RBX = r, ((FILE *)m)->_flags == r->_flags)) &&
     (*(int *)&pFVar11->field_0x4 == *(int *)&r->field_0x4)) {
    if ((r != (FILE *)m) && (r != pFVar11)) {
      mod2dense_clear((mod2dense *)r);
      iVar23 = extraout_EAX_00;
      if (0 < *(int *)&r->field_0x4) {
        lVar22 = 0;
        do {
          if (0 < pFVar11->_flags) {
            lVar26 = 0;
            do {
              iVar23 = mod2dense_get((mod2dense *)pFVar11,(int)lVar26,(int)lVar22);
              if ((iVar23 != 0) && (0 < *(int *)&r->_IO_read_ptr)) {
                lVar4 = *(long *)(&((mod2entry *)((FILE *)m)->_IO_read_end)->row + lVar26 * 2);
                lVar5 = *(long *)(&((mod2entry *)r->_IO_read_end)->row + lVar22 * 2);
                lVar24 = 0;
                do {
                  puVar20 = (uint *)(lVar5 + lVar24 * 4);
                  *puVar20 = *puVar20 ^ *(uint *)(lVar4 + lVar24 * 4);
                  lVar24 = lVar24 + 1;
                } while (lVar24 < *(int *)&r->_IO_read_ptr);
              }
              lVar26 = lVar26 + 1;
            } while (lVar26 < pFVar11->_flags);
          }
          lVar22 = lVar22 + 1;
          iVar23 = *(int *)&r->field_0x4;
        } while (lVar22 < iVar23);
      }
      return iVar23;
    }
  }
  else {
    mod2dense_multiply_cold_1();
  }
  mod2dense_multiply_cold_2();
  uVar9 = ((FILE *)m)->_flags;
  uVar10 = (ulong)uVar9;
  if (uVar9 == pFVar11->_flags) {
    uVar2 = *(uint *)&((FILE *)m)->field_0x4;
    if (uVar2 == *(uint *)&pFVar11->field_0x4) {
      if (0 < (int)uVar2) {
        uVar10 = (ulong)(*(int *)&((FILE *)m)->_IO_read_ptr - 1);
        uVar16 = 0;
        do {
          if (*(int *)&((FILE *)m)->_IO_read_ptr < 2) {
            uVar21 = 0;
          }
          else {
            uVar27 = 0;
            do {
              if (*(int *)(*(long *)(&((mod2entry *)((FILE *)m)->_IO_read_end)->row + uVar16 * 2) +
                          uVar27 * 4) !=
                  *(int *)(*(long *)(&((mod2entry *)pFVar11->_IO_read_end)->row + uVar16 * 2) +
                          uVar27 * 4)) {
                return 0;
              }
              uVar27 = uVar27 + 1;
              uVar21 = uVar10;
            } while (uVar10 != uVar27);
          }
          if (((*(uint *)(*(long *)(&((mod2entry *)pFVar11->_IO_read_end)->row + uVar16 * 2) +
                         uVar21 * 4) ^
               *(uint *)(*(long *)(&((mod2entry *)((FILE *)m)->_IO_read_end)->row + uVar16 * 2) +
                        uVar21 * 4)) & ~(-1 << ((byte)uVar9 & 0x1f))) != 0) {
            return 0;
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 != uVar2);
      }
      return 1;
    }
  }
  mod2dense_equal_cold_1();
  uVar9 = ((FILE *)m)->_flags;
  uVar16 = (ulong)uVar9;
  r_00 = pFVar11;
  if (uVar9 == *(uint *)&((FILE *)m)->field_0x4) {
    if (pFVar11 != (FILE *)m) {
      if ((pFVar11->_flags == uVar9) && (*(uint *)&pFVar11->field_0x4 == uVar9)) {
        uVar2 = *(uint *)&((FILE *)m)->_IO_read_ptr;
        mod2dense_clear((mod2dense *)pFVar11);
        if (0 < (int)uVar9) {
          uVar18 = 0;
          do {
            mod2dense_set((mod2dense *)pFVar11,uVar18,uVar18,1);
            uVar18 = uVar18 + 1;
          } while (uVar9 != uVar18);
        }
        if (0 < (int)uVar9) {
          uVar10 = 0;
          do {
            uVar27 = uVar10 >> 5 & 0x7ffffff;
            bVar15 = (byte)uVar10 & 0x1f;
            uVar21 = uVar10;
            do {
              uVar25 = uVar21;
              if ((*(uint *)(*(long *)(&((mod2entry *)((FILE *)m)->_IO_read_end)->row + uVar21 * 2)
                            + uVar27 * 4) & 1 << bVar15) != 0) break;
              uVar21 = uVar21 + 1;
              uVar25 = uVar16;
            } while (uVar16 != uVar21);
            if ((uint)uVar25 == uVar9) {
              return 0;
            }
            uVar25 = uVar25 & 0xffffffff;
            if (uVar10 != uVar25) {
              pmVar13 = (mod2entry *)((FILE *)m)->_IO_read_end;
              uVar6 = *(undefined8 *)(&pmVar13->row + uVar10 * 2);
              *(undefined8 *)(&pmVar13->row + uVar10 * 2) =
                   *(undefined8 *)(&pmVar13->row + uVar25 * 2);
              *(undefined8 *)(&((mod2entry *)((FILE *)m)->_IO_read_end)->row + uVar25 * 2) = uVar6;
              pmVar13 = (mod2entry *)pFVar11->_IO_read_end;
              uVar6 = *(undefined8 *)(&pmVar13->row + uVar10 * 2);
              *(undefined8 *)(&pmVar13->row + uVar10 * 2) =
                   *(undefined8 *)(&pmVar13->row + uVar25 * 2);
              *(undefined8 *)(&((mod2entry *)pFVar11->_IO_read_end)->row + uVar25 * 2) = uVar6;
            }
            uVar21 = 0;
            do {
              if (uVar21 != uVar10) {
                lVar22 = *(long *)(&((mod2entry *)((FILE *)m)->_IO_read_end)->row + uVar21 * 2);
                if ((*(uint *)(lVar22 + uVar27 * 4) & 1 << bVar15) != 0) {
                  if ((int)uVar27 < (int)uVar2) {
                    lVar26 = *(long *)(&((mod2entry *)((FILE *)m)->_IO_read_end)->row + uVar10 * 2);
                    uVar25 = uVar10 >> 5;
                    do {
                      puVar20 = (uint *)(lVar22 + uVar25 * 4);
                      *puVar20 = *puVar20 ^ *(uint *)(lVar26 + uVar25 * 4);
                      uVar25 = uVar25 + 1;
                    } while ((uVar2 + (int)(uVar10 >> 5)) - (int)uVar27 != uVar25);
                  }
                  if (0 < (int)uVar2) {
                    lVar22 = *(long *)(&((mod2entry *)pFVar11->_IO_read_end)->row + uVar21 * 2);
                    lVar26 = *(long *)(&((mod2entry *)pFVar11->_IO_read_end)->row + uVar10 * 2);
                    uVar25 = 0;
                    do {
                      puVar20 = (uint *)(lVar22 + uVar25 * 4);
                      *puVar20 = *puVar20 ^ *(uint *)(lVar26 + uVar25 * 4);
                      uVar25 = uVar25 + 1;
                    } while (uVar2 != uVar25);
                  }
                }
              }
              uVar21 = uVar21 + 1;
            } while (uVar21 != uVar16);
            uVar10 = uVar10 + 1;
          } while (uVar10 != uVar16);
        }
        return 1;
      }
      mod2dense_invert_cold_2();
      unaff_RBX = pFVar11;
      goto LAB_001238c0;
    }
  }
  else {
LAB_001238c0:
    pFVar11 = unaff_RBX;
    mod2dense_invert_cold_1();
  }
  mod2dense_invert_cold_3();
  if (r_00 != (FILE *)m) {
    iVar23 = ((FILE *)m)->_flags;
    lVar22 = (long)iVar23;
    if (r_00->_flags == iVar23) {
      uVar9 = *(uint *)&((FILE *)m)->field_0x4;
      uVar21 = (ulong)uVar9;
      if (*(uint *)&r_00->field_0x4 == uVar9) {
        uVar2 = *(uint *)&((FILE *)m)->_IO_read_ptr;
        uVar16 = (ulong)uVar2;
        mod2dense_clear((mod2dense *)r_00);
        auVar7 = _DAT_00127fa0;
        if (0 < iVar23) {
          lVar26 = lVar22 + -1;
          auVar30._8_4_ = (int)lVar26;
          auVar30._0_8_ = lVar26;
          auVar30._12_4_ = (int)((ulong)lVar26 >> 0x20);
          uVar27 = 0;
          auVar30 = auVar30 ^ _DAT_00127fa0;
          auVar31 = _DAT_00127f90;
          do {
            auVar32 = auVar31 ^ auVar7;
            if ((bool)(~(auVar32._4_4_ == auVar30._4_4_ && auVar30._0_4_ < auVar32._0_4_ ||
                        auVar30._4_4_ < auVar32._4_4_) & 1)) {
              *(int *)(extraout_RDX_01 + uVar27 * 4) = (int)uVar27;
            }
            if ((auVar32._12_4_ != auVar30._12_4_ || auVar32._8_4_ <= auVar30._8_4_) &&
                auVar32._12_4_ <= auVar30._12_4_) {
              *(int *)(extraout_RDX_01 + 4 + uVar27 * 4) = (int)uVar27 + 1;
            }
            uVar27 = uVar27 + 2;
            lVar26 = auVar31._8_8_;
            auVar31._0_8_ = auVar31._0_8_ + 2;
            auVar31._8_8_ = lVar26 + 2;
          } while ((iVar23 + 1U & 0xfffffffe) != uVar27);
        }
        if ((int)uVar9 < 1) {
          uVar27 = 0;
        }
        else {
          uVar27 = 0;
          do {
            *(int *)(uVar10 + uVar27 * 4) = (int)uVar27;
            uVar27 = uVar27 + 1;
          } while (uVar21 != uVar27);
        }
        lStack_f0 = 0;
        uVar25 = 0;
        do {
          uVar18 = iVar23 - (int)lStack_f0;
          uVar17 = (ulong)uVar18;
          if ((long)uVar25 < (long)(int)uVar18) {
            lStack_f0 = (long)(int)lStack_f0;
            do {
              uVar18 = *(uint *)(extraout_RDX_01 + uVar25 * 4);
              iStack_e4 = (int)uVar18 >> 5;
              uStack_e8 = uVar18 & 0x1f;
              uVar27 = uVar25;
              if ((long)uVar25 < (long)(int)uVar9) {
                do {
                  if ((*(uint *)(*(long *)(&((mod2entry *)((FILE *)m)->_IO_read_end)->row +
                                          (long)*(int *)(uVar10 + uVar27 * 4) * 2) +
                                (long)iStack_e4 * 4) & 1 << (sbyte)uStack_e8) != 0)
                  goto LAB_00123a89;
                  uVar27 = uVar27 + 1;
                } while (uVar21 != uVar27);
              }
              lStack_f0 = lStack_f0 + 1;
              *(undefined4 *)(extraout_RDX_01 + uVar25 * 4) =
                   *(undefined4 *)(extraout_RDX_01 + (lVar22 - lStack_f0) * 4);
              *(uint *)(extraout_RDX_01 + (lVar22 - lStack_f0) * 4) = uVar18;
              uVar17 = lVar22 - lStack_f0;
            } while ((long)uVar25 < (long)uVar17);
          }
LAB_00123a89:
          if (uVar25 == (uVar17 & 0xffffffff)) {
            if ((int)uVar17 < iVar23) {
              pmVar13 = (mod2entry *)r_00->_IO_read_end;
              lVar26 = (long)(int)uVar17;
              do {
                if (0 < (int)uVar2) {
                  memset(*(void **)(&pmVar13->row + (long)*(int *)(uVar10 + lVar26 * 4) * 2),0,
                         uVar16 * 4);
                }
                lVar26 = lVar26 + 1;
              } while (lVar22 != lVar26);
            }
            return (int)lStack_f0;
          }
          uVar18 = *(uint *)(uVar10 + (long)(int)uVar27 * 4);
          *(undefined4 *)(uVar10 + (long)(int)uVar27 * 4) = *(undefined4 *)(uVar10 + uVar25 * 4);
          *(uint *)(uVar10 + uVar25 * 4) = uVar18;
          mod2dense_set((mod2dense *)r_00,*(int *)(extraout_RDX_01 + uVar25 * 4),uVar18,1);
          if ((int)uVar9 < 1) {
            uVar27 = 0;
          }
          else {
            uVar27 = 0;
            do {
              if (uVar27 != uVar18) {
                lVar26 = *(long *)(&((mod2entry *)((FILE *)m)->_IO_read_end)->row + uVar27 * 2);
                if ((*(uint *)(lVar26 + (long)iStack_e4 * 4) & 1 << ((byte)uStack_e8 & 0x1f)) != 0)
                {
                  if (0 < (int)uVar2) {
                    lVar4 = *(long *)(&((mod2entry *)((FILE *)m)->_IO_read_end)->row +
                                     (long)(int)uVar18 * 2);
                    uVar17 = 0;
                    do {
                      puVar20 = (uint *)(lVar26 + uVar17 * 4);
                      *puVar20 = *puVar20 ^ *(uint *)(lVar4 + uVar17 * 4);
                      uVar17 = uVar17 + 1;
                    } while (uVar16 != uVar17);
                  }
                  if (0 < (int)uVar2) {
                    lVar26 = *(long *)(&((mod2entry *)r_00->_IO_read_end)->row + uVar27 * 2);
                    lVar4 = *(long *)(&((mod2entry *)r_00->_IO_read_end)->row +
                                     (long)(int)uVar18 * 2);
                    uVar17 = 0;
                    do {
                      puVar20 = (uint *)(lVar26 + uVar17 * 4);
                      *puVar20 = *puVar20 ^ *(uint *)(lVar4 + uVar17 * 4);
                      uVar17 = uVar17 + 1;
                    } while (uVar16 != uVar17);
                  }
                }
              }
              uVar27 = uVar27 + 1;
            } while (uVar27 != uVar21);
          }
          uVar25 = uVar25 + 1;
        } while( true );
      }
    }
    mod2dense_invert_selected_cold_1();
  }
  mod2dense_invert_selected_cold_2();
  uVar9 = ((FILE *)m)->_flags;
  pFVar28 = (FILE *)(ulong)uVar9;
  if (uVar9 == *(uint *)&((FILE *)m)->field_0x4) {
    if (r_00 == (FILE *)m) goto LAB_00123ddb;
    if ((r_00->_flags == uVar9) && (*(uint *)&r_00->field_0x4 == uVar9)) {
      uVar2 = *(uint *)&((FILE *)m)->_IO_read_ptr;
      mod2dense_clear((mod2dense *)r_00);
      if (0 < (int)uVar9) {
        uVar18 = 0;
        do {
          mod2dense_set((mod2dense *)r_00,uVar18,uVar18,1);
          uVar18 = uVar18 + 1;
        } while (uVar9 != uVar18);
      }
      if (0 < (int)uVar9) {
        pFVar11 = (FILE *)0x0;
        do {
          *(undefined4 *)(extraout_RDX_02 + (long)pFVar11 * 4) = 0xffffffff;
          *(int *)(uVar10 + (long)pFVar11 * 4) = (int)pFVar11;
          pFVar11 = (FILE *)((long)&pFVar11->_flags + 1);
        } while (pFVar28 != pFVar11);
      }
      if (0 < (int)uVar9) {
        pFVar11 = (FILE *)0x0;
        do {
          uVar18 = (uint)pFVar11;
          uVar16 = (ulong)pFVar11 >> 5 & 0x7ffffff;
          bVar15 = (byte)pFVar11 & 0x1f;
          pFVar12 = pFVar11;
          do {
            if ((*(uint *)(*(long *)(&((mod2entry *)((FILE *)m)->_IO_read_end)->row +
                                    (long)pFVar12 * 2) + uVar16 * 4) & 1 << bVar15) != 0)
            goto LAB_00123c98;
            pFVar12 = (FILE *)((long)&pFVar12->_flags + 1);
          } while (pFVar28 != pFVar12);
          pFVar12 = (FILE *)(ulong)uVar9;
LAB_00123c98:
          uVar8 = (uint)pFVar12;
          if ((uint)pFVar12 == uVar9) {
            mod2dense_set(m,uVar18,uVar18,1);
            *(uint *)(extraout_RDX_02 + (long)pFVar11 * 4) = uVar18;
            uVar8 = uVar18;
          }
          if (pFVar11 != (FILE *)(ulong)uVar8) {
            pmVar13 = (mod2entry *)((FILE *)m)->_IO_read_end;
            uVar6 = *(undefined8 *)(&pmVar13->row + (long)pFVar11 * 2);
            lVar22 = (long)(int)uVar8;
            *(undefined8 *)(&pmVar13->row + (long)pFVar11 * 2) =
                 *(undefined8 *)(&pmVar13->row + lVar22 * 2);
            *(undefined8 *)(&((mod2entry *)((FILE *)m)->_IO_read_end)->row + lVar22 * 2) = uVar6;
            pmVar13 = (mod2entry *)r_00->_IO_read_end;
            uVar6 = *(undefined8 *)(&pmVar13->row + (long)pFVar11 * 2);
            *(undefined8 *)(&pmVar13->row + (long)pFVar11 * 2) =
                 *(undefined8 *)(&pmVar13->row + lVar22 * 2);
            *(undefined8 *)(&((mod2entry *)r_00->_IO_read_end)->row + lVar22 * 2) = uVar6;
            uVar3 = *(undefined4 *)(uVar10 + (long)pFVar11 * 4);
            *(undefined4 *)(uVar10 + (long)pFVar11 * 4) = *(undefined4 *)(uVar10 + lVar22 * 4);
            *(undefined4 *)(uVar10 + lVar22 * 4) = uVar3;
          }
          pFVar12 = (FILE *)0x0;
          do {
            if (pFVar12 != pFVar11) {
              lVar22 = *(long *)(&((mod2entry *)((FILE *)m)->_IO_read_end)->row + (long)pFVar12 * 2)
              ;
              if ((*(uint *)(lVar22 + uVar16 * 4) & 1 << bVar15) != 0) {
                if ((int)uVar16 < (int)uVar2) {
                  lVar26 = *(long *)(&((mod2entry *)((FILE *)m)->_IO_read_end)->row +
                                    (long)pFVar11 * 2);
                  uVar21 = (ulong)pFVar11 >> 5;
                  do {
                    puVar20 = (uint *)(lVar22 + uVar21 * 4);
                    *puVar20 = *puVar20 ^ *(uint *)(lVar26 + uVar21 * 4);
                    uVar21 = uVar21 + 1;
                  } while ((uVar2 + (int)((ulong)pFVar11 >> 5)) - (int)uVar16 != uVar21);
                }
                if (0 < (int)uVar2) {
                  lVar22 = *(long *)(&((mod2entry *)r_00->_IO_read_end)->row + (long)pFVar12 * 2);
                  lVar26 = *(long *)(&((mod2entry *)r_00->_IO_read_end)->row + (long)pFVar11 * 2);
                  uVar21 = 0;
                  do {
                    puVar20 = (uint *)(lVar22 + uVar21 * 4);
                    *puVar20 = *puVar20 ^ *(uint *)(lVar26 + uVar21 * 4);
                    uVar21 = uVar21 + 1;
                  } while (uVar2 != uVar21);
                }
              }
            }
            pFVar12 = (FILE *)((long)&pFVar12->_flags + 1);
          } while (pFVar12 != pFVar28);
          pFVar11 = (FILE *)((long)&pFVar11->_flags + 1);
        } while (pFVar11 != pFVar28);
      }
      if ((int)uVar9 < 1) {
        iVar23 = 0;
      }
      else {
        pFVar11 = (FILE *)0x0;
        iVar23 = 0;
        do {
          iVar19 = *(int *)(extraout_RDX_02 + (long)pFVar11 * 4);
          if (iVar19 != -1) {
            *(int *)(extraout_RDX_02 + (long)iVar23 * 4) = iVar19;
            *(undefined4 *)(uVar10 + (long)iVar23 * 4) = *(undefined4 *)(uVar10 + (long)pFVar11 * 4)
            ;
            iVar23 = iVar23 + 1;
          }
          pFVar11 = (FILE *)((long)&pFVar11->_flags + 1);
        } while (pFVar28 != pFVar11);
      }
      return iVar23;
    }
    mod2dense_forcibly_invert_cold_2();
  }
  mod2dense_forcibly_invert_cold_1();
LAB_00123ddb:
  mod2dense_forcibly_invert_cold_3();
  if ((((FILE *)m)->_flags <= r_00->_flags) &&
     (pFVar11 = r_00, pFVar28 = (FILE *)m,
     *(int *)&((FILE *)m)->field_0x4 <= *(int *)&r_00->field_0x4)) {
    mod2dense_clear((mod2dense *)r_00);
    iVar23 = extraout_EAX_01;
    if (0 < ((FILE *)m)->_flags) {
      lVar22 = 0;
      do {
        for (pmVar13 = ((mod2entry *)((FILE *)m)->_IO_read_ptr)[lVar22].right; -1 < pmVar13->row;
            pmVar13 = pmVar13->right) {
          mod2dense_set((mod2dense *)r_00,(int)lVar22,pmVar13->col,1);
        }
        lVar22 = lVar22 + 1;
        iVar23 = ((FILE *)m)->_flags;
      } while (lVar22 < iVar23);
    }
    return iVar23;
  }
  mod2sparse_to_dense_cold_1();
  pFStack_198 = pFVar11;
  pFStack_190 = pFVar28;
  uStack_188 = uVar16;
  if ((((FILE *)m)->_flags <= r_00->_flags) &&
     (pFVar11 = r_00, pFVar28 = (FILE *)m,
     *(int *)&((FILE *)m)->field_0x4 <= *(int *)&r_00->field_0x4)) {
    pcStack_1a8 = (code *)0x123e7c;
    mod2sparse_clear((mod2sparse *)r_00);
    iVar23 = (int)extraout_RAX_00;
    if (0 < ((FILE *)m)->_flags) {
      iVar19 = 0;
      pmVar13 = extraout_RAX_00;
      do {
        if (0 < *(int *)&((FILE *)m)->field_0x4) {
          iVar23 = 0;
          do {
            pcStack_1a8 = (code *)0x123e9b;
            uVar9 = mod2dense_get(m,iVar19,iVar23);
            pmVar13 = (mod2entry *)(ulong)uVar9;
            if (uVar9 != 0) {
              pcStack_1a8 = (code *)0x123eac;
              pmVar13 = mod2sparse_insert((mod2sparse *)r_00,iVar19,iVar23);
            }
            iVar23 = iVar23 + 1;
          } while (iVar23 < *(int *)&((FILE *)m)->field_0x4);
        }
        iVar23 = (int)pmVar13;
        iVar19 = iVar19 + 1;
      } while (iVar19 < ((FILE *)m)->_flags);
    }
    return iVar23;
  }
  pcStack_1a8 = intio_read;
  mod2dense_to_sparse_cold_1();
  lVar22 = 0;
  pFStack_1b8 = pFVar11;
  pFStack_1b0 = pFVar28;
  pcStack_1a8 = (code *)uVar16;
  do {
    sVar14 = fread((void *)((long)&iStack_1bc + lVar22),1,1,(FILE *)m);
    if (sVar14 != 1) {
      return 0;
    }
    lVar22 = lVar22 + 1;
  } while (lVar22 != 4);
  return iStack_1bc;
}

Assistant:

int mod2dense_flip  
( mod2dense *m, 	/* Matrix to flip element in */
  int row,		/* Row of element (starting with zero) */
  int col		/* Column of element (starting with zero) */
)
{
  mod2word *w;
  int b;

  if (row<0 || row>=mod2dense_rows(m) || col<0 || col>=mod2dense_cols(m))
  { fprintf(stderr,"mod2dense_flip: row or column index out of bounds\n");
    exit(1);
  }

  b = 1 ^ mod2_getbit (m->col[col][row>>mod2_wordsize_shift], 
                       row&mod2_wordsize_mask);

  w = &m->col[col][row>>mod2_wordsize_shift];

  *w = b ? mod2_setbit1(*w,row&mod2_wordsize_mask) 
         : mod2_setbit0(*w,row&mod2_wordsize_mask);

  return b;
}